

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O2

void __thiscall vector<server::_flagrun>::growbuf(vector<server::_flagrun> *this,int sz)

{
  uint uVar1;
  _flagrun *__src;
  int iVar2;
  _flagrun *__dest;
  ulong uVar4;
  ulong uVar3;
  
  uVar1 = this->alen;
  uVar4 = (ulong)uVar1;
  uVar3 = uVar4;
  if (uVar4 == 0) {
    iVar2 = 8;
    if (8 < sz) {
      iVar2 = sz;
    }
    this->alen = iVar2;
  }
  else {
    while (iVar2 = (int)uVar3, iVar2 < sz) {
      this->alen = iVar2 * 2;
      uVar3 = (ulong)(uint)(iVar2 * 2);
    }
  }
  if ((int)uVar1 < iVar2) {
    __dest = (_flagrun *)operator_new__((long)iVar2 << 5);
    if (0 < (int)uVar1) {
      __src = this->buf;
      memcpy(__dest,__src,uVar4 << 5);
      if (__src != (_flagrun *)0x0) {
        operator_delete__(__src);
      }
    }
    this->buf = __dest;
  }
  return;
}

Assistant:

void growbuf(int sz)
    {
        int olen = alen;
        if(!alen) alen = max(MINSIZE, sz);
        else while(alen < sz) alen *= 2;
        if(alen <= olen) return;
        uchar *newbuf = new uchar[alen*sizeof(T)];
        if(olen > 0)
        {
            memcpy(newbuf, (void *)buf, olen*sizeof(T));
            delete[] (uchar *)buf;
        }
        buf = (T *)newbuf;
    }